

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O2

void chan_set4op(opl_chip *chip,Bit8u data)

{
  Bit8u bit;
  uint uVar1;
  byte bVar2;
  undefined3 in_register_00000031;
  bool bVar3;
  
  for (uVar1 = 0; uVar1 != 6; uVar1 = uVar1 + 1) {
    bVar2 = (byte)uVar1 + 6;
    if (uVar1 < 3) {
      bVar2 = (byte)uVar1;
    }
    bVar3 = (CONCAT31(in_register_00000031,data) >> (uVar1 & 0x1f) & 1) != 0;
    chip->channel[bVar2].chtype = bVar3;
    chip->channel[(ulong)bVar2 + 3].chtype = bVar3 * '\x02';
  }
  return;
}

Assistant:

void chan_set4op(opl_chip *chip, Bit8u data) {
	for (Bit8u bit = 0; bit < 6; bit++) {
		Bit8u chnum = bit;
		if (bit >= 3) {
			chnum += 9 - 3;
		}
		if ((data >> bit) & 0x01) {
			chip->channel[chnum].chtype = ch_4op;
			chip->channel[chnum + 3].chtype = ch_4op2;
		}
		else {
			chip->channel[chnum].chtype = ch_2op;
			chip->channel[chnum + 3].chtype = ch_2op;
		}
	}
}